

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall cfd::core::ExtPubkey::ExtPubkey(ExtPubkey *this,string *base58_data)

{
  ByteData256 local_30;
  string *local_18;
  string *base58_data_local;
  ExtPubkey *this_local;
  
  local_18 = base58_data;
  base58_data_local = (string *)this;
  ByteData256::ByteData256(&local_30);
  ExtPubkey(this,base58_data,&local_30);
  ByteData256::~ByteData256(&local_30);
  return;
}

Assistant:

ExtPubkey::ExtPubkey(const std::string& base58_data)
    : ExtPubkey(base58_data, ByteData256()) {
  // do nothing
}